

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reference_values.cxx
# Opt level: O0

gga_reference * gen_gga_reference_values(Backend backend,Kernel kern,Spin polar)

{
  gga_reference *in_RDI;
  XCKernel func;
  gga_reference *ref_vals;
  size_t in_stack_fffffffffffffef8;
  gga_reference *in_stack_ffffffffffffff00;
  gga_reference *this;
  pair<int,_std::vector<double,_std::allocator<double>_>_> *in_stack_ffffffffffffff08;
  vector<double,_std::allocator<double>_> *args_2;
  tuple<int_&,_std::vector<double,_std::allocator<double>_>_&> *in_stack_ffffffffffffff10;
  vector<double,_std::allocator<double>_> *args_1;
  int *args;
  vector<double,_std::allocator<double>_> *this_00;
  double **args_5;
  double *local_b8;
  double *local_b0;
  undefined8 in_stack_ffffffffffffff58;
  Spin s;
  int local_88 [4];
  vector<double,_std::allocator<double>_> local_78 [2];
  double *local_38 [4];
  byte local_15;
  
  s = (Spin)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  local_15 = 0;
  gga_reference::gga_reference(in_stack_ffffffffffffff00);
  load_reference_density(s);
  std::tie<int,std::vector<double,std::allocator<double>>>
            (&in_stack_ffffffffffffff08->first,
             (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff00);
  args_5 = local_38;
  std::tuple<int&,std::vector<double,std::allocator<double>>&>::operator=
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::pair<int,_std::vector<double,_std::allocator<double>_>_>::~pair
            ((pair<int,_std::vector<double,_std::allocator<double>_>_> *)0x1877d3);
  load_reference_sigma(s);
  args = local_88;
  std::tie<int,std::vector<double,std::allocator<double>>>
            (&in_stack_ffffffffffffff08->first,
             (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff00);
  this_00 = local_78;
  std::tuple<int&,std::vector<double,std::allocator<double>>&>::operator=
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::pair<int,_std::vector<double,_std::allocator<double>_>_>::~pair
            ((pair<int,_std::vector<double,_std::allocator<double>_>_> *)0x187828);
  ExchCXX::XCKernel::XCKernel
            ((XCKernel *)in_stack_ffffffffffffff10,
             (Backend)((ulong)in_stack_ffffffffffffff08 >> 0x20),(Kernel)in_stack_ffffffffffffff08,
             (Spin)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  args_1 = &in_RDI->exc;
  ExchCXX::XCKernel::exc_buffer_len((XCKernel *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8)
  ;
  std::vector<double,_std::allocator<double>_>::resize(this_00,(size_type)args);
  args_2 = &in_RDI->vrho;
  ExchCXX::XCKernel::vrho_buffer_len
            ((XCKernel *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  std::vector<double,_std::allocator<double>_>::resize(this_00,(size_type)args);
  this = (gga_reference *)&in_RDI->vsigma;
  ExchCXX::XCKernel::vsigma_buffer_len((XCKernel *)this,in_stack_fffffffffffffef8);
  std::vector<double,_std::allocator<double>_>::resize(this_00,(size_type)args);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x1878de);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x1878f1);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x187904);
  local_b0 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x187917);
  local_b8 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x18792a);
  ExchCXX::XCKernel::eval_exc_vxc<int&,double*,double*,double*,double*,double*>
            ((XCKernel *)this_00,args,(double **)args_1,(double **)args_2,(double **)this,&local_b8,
             args_5);
  local_15 = 1;
  ExchCXX::XCKernel::~XCKernel((XCKernel *)0x187971);
  if ((local_15 & 1) == 0) {
    gga_reference::~gga_reference(this);
  }
  return in_RDI;
}

Assistant:

gga_reference gen_gga_reference_values(ExchCXX::Backend backend, 
  ExchCXX::Kernel kern, ExchCXX::Spin polar) {
  
  using namespace ExchCXX;
  gga_reference ref_vals;
  std::tie( ref_vals.npts, ref_vals.rho )   = load_reference_density( polar );
  std::tie( ref_vals.npts, ref_vals.sigma ) = load_reference_sigma( polar );

  XCKernel func( backend, kern, polar );

  ref_vals.exc.resize( func.exc_buffer_len( ref_vals.npts ) );
  ref_vals.vrho.resize( func.vrho_buffer_len( ref_vals.npts ) );
  ref_vals.vsigma.resize( func.vsigma_buffer_len( ref_vals.npts ) );

  func.eval_exc_vxc( ref_vals.npts, ref_vals.rho.data(), ref_vals.sigma.data(), 
    ref_vals.exc.data(), ref_vals.vrho.data(), ref_vals.vsigma.data() );

  return ref_vals;

}